

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter_base.h
# Opt level: O0

void __thiscall QStringConverterBase::State::State(State *this,Flags f)

{
  long lVar1;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

constexpr State(Flags f = Flag::Default) noexcept
            : flags(f), state_data{0, 0, 0, 0} {}